

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

int __thiscall deqp::egl::GLES2ThreadTest::FenceSync::init(FenceSync *this,EVP_PKEY_CTX *ctx)

{
  _func_int **pp_Var1;
  deBool dVar2;
  int extraout_EAX;
  GLES2Context *pGVar3;
  MessageBuilder *pMVar4;
  EGLSyncKHR pvVar5;
  TestError *this_00;
  byte in_DL;
  EGLSyncKHR local_360;
  MessageBuilder local_358;
  EGLDisplay local_1c8 [3];
  MessageBuilder local_1b0;
  byte local_19;
  Thread *pTStack_18;
  bool serverSync_local;
  EGLThread *thread_local;
  FenceSync *this_local;
  
  local_19 = in_DL & 1;
  pTStack_18 = (Thread *)ctx;
  thread_local = (EGLThread *)this;
  pGVar3 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                     ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)(ctx + 0xb0));
  this->m_display = pGVar3->display;
  this->m_serverSync = (bool)(local_19 & 1);
  de::Mutex::lock(&this->m_lock);
  if (0 < this->m_waiterCount) {
    tcu::ThreadUtil::Thread::newMessage(&local_1b0,pTStack_18);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [27])"Begin -- eglCreateSyncKHR(");
    local_1c8[0] = this->m_display;
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(unsigned_long *)local_1c8);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar4,(char (*) [31])", EGL_SYNC_FENCE_KHR, DE_NULL)");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
    pp_Var1 = pTStack_18[1].super_Thread._vptr_Thread;
    pvVar5 = (EGLSyncKHR)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,this->m_display,0x30f9,0);
    this->m_sync = pvVar5;
    tcu::ThreadUtil::Thread::newMessage(&local_358,pTStack_18);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_358,(char (*) [8])"End -- ");
    local_360 = this->m_sync;
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(unsigned_long *)&local_360);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar4,(char (*) [22])" = eglCreateSyncKHR()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_358);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) || (this->m_sync == (EGLSyncKHR)0x0)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"m_sync",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0x12f);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  de::Mutex::unlock(&this->m_lock);
  return extraout_EAX;
}

Assistant:

void FenceSync::init (EGLThread& thread, bool serverSync)
{
	m_display		= thread.runtimeContext->display;
	m_serverSync	= serverSync;

	// Use sync only if somebody will actualy depend on it
	m_lock.lock();
	if (m_waiterCount > 0)
	{
		thread.newMessage() << "Begin -- eglCreateSyncKHR(" << ((size_t)m_display) << ", EGL_SYNC_FENCE_KHR, DE_NULL)" << tcu::ThreadUtil::Message::End;
		m_sync = thread.egl.createSyncKHR(m_display, EGL_SYNC_FENCE_KHR, DE_NULL);
		thread.newMessage() << "End -- " << ((size_t)m_sync) << " = eglCreateSyncKHR()" << tcu::ThreadUtil::Message::End;
		TCU_CHECK(m_sync);
	}
	m_lock.unlock();
}